

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signals.cpp
# Opt level: O3

void set_standard_handler_restart(int signum,bool restart)

{
  mapped_type *pmVar1;
  undefined7 in_register_00000031;
  undefined4 in_register_0000003c;
  
  pmVar1 = std::
           map<int,_std::reference_wrapper<const_(anonymous_namespace)::SignalAction>,_std::less<int>,_std::allocator<std::pair<const_int,_std::reference_wrapper<const_(anonymous_namespace)::SignalAction>_>_>_>
           ::at((map<int,_std::reference_wrapper<const_(anonymous_namespace)::SignalAction>,_std::less<int>,_std::allocator<std::pair<const_int,_std::reference_wrapper<const_(anonymous_namespace)::SignalAction>_>_>_>
                 *)CONCAT44(in_register_0000003c,signum),
                (key_type *)CONCAT71(in_register_00000031,restart));
  anon_unknown.dwarf_6212e::SignalAction::apply_to(pmVar1->_M_data,signum,restart);
  return;
}

Assistant:

void set_standard_handler_restart(int signum, bool restart) {
    try {
        signal_actions.at(signum).get().apply_to(signum, restart);
    } catch (std::out_of_range &e) {
        die(format("%d is invalid signum", signum));
    }
}